

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  double __value;
  int iVar1;
  CascadeStages<2,_Iir::DirectFormII> *this;
  Storage SVar2;
  double a;
  int i_1;
  double b2;
  double b;
  int i;
  Storage coeffRet;
  SOSCascade<2,_Iir::DirectFormII> f;
  double coeff [2] [6];
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  SOSCascade<2,_Iir::DirectFormII> *in_stack_fffffffffffffed0;
  int b_00;
  int local_124;
  double local_118;
  int local_10c;
  undefined4 in_stack_fffffffffffffefc;
  undefined1 local_78 [116];
  undefined4 local_4;
  
  local_4 = 0;
  memcpy(local_78,&DAT_00105030,0x60);
  Iir::Custom::SOSCascade<2,_Iir::DirectFormII>::SOSCascade
            (in_stack_fffffffffffffed0,
             (double (*) [2] [6])CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  SVar2 = Iir::CascadeStages<2,_Iir::DirectFormII>::getCascadeStorage
                    ((CascadeStages<2,_Iir::DirectFormII> *)0x101336);
  this = (CascadeStages<2,_Iir::DirectFormII> *)SVar2.stageArray;
  iVar1 = SVar2.maxStages;
  for (local_10c = 0; local_10c < 2; local_10c = local_10c + 1) {
    assert_print((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    assert_print((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    assert_print((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    assert_print((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    assert_print((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    assert_print((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  }
  local_118 = 0.0;
  for (local_124 = 0; b_00 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20), local_124 < 10000;
      local_124 = local_124 + 1) {
    in_stack_fffffffffffffed0 = (SOSCascade<2,_Iir::DirectFormII> *)0x0;
    if (local_124 == 10) {
      in_stack_fffffffffffffed0 = (SOSCascade<2,_Iir::DirectFormII> *)0x3ff0000000000000;
    }
    __value = Iir::CascadeStages<2,_Iir::DirectFormII>::filter<double>
                        (this,(double)CONCAT44(in_stack_fffffffffffffefc,iVar1));
    std::isnan(__value);
    assert_print((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    if ((0x14 < local_124) && (local_124 < 100)) {
      in_stack_fffffffffffffecf = true;
      if ((__value == 0.0) && (!NAN(__value))) {
        in_stack_fffffffffffffecf = local_118 != 0.0;
      }
      assert_print((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    }
    local_118 = __value;
  }
  fprintf(_stderr,"Final filter value: %e\n",SUB84(local_118,0));
  assert_print(b_00,(char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  return 0;
}

Assistant:

int main (int,char**)
{
	// generated with: "elliptic_design.py"
	const double coeff[][6] = {
		{1.665623674062209972e-02,
		 -3.924801366970616552e-03,
		 1.665623674062210319e-02,
		 1.000000000000000000e+00,
		 -1.715403014004022175e+00,
		 8.100474793174089472e-01},
		{1.000000000000000000e+00,
		 -1.369778997100624895e+00,
		 1.000000000000000222e+00,
		 1.000000000000000000e+00,
		 -1.605878925999785656e+00,
		 9.538657786383895054e-01}};

	Iir::Custom::SOSCascade<2> f(coeff);

	auto coeffRet = f.getCascadeStorage();
	for(int i = 0; i < 2; i++) {
	    assert_print(coeffRet.stageArray[i].m_a0 == coeff[i][3],"m_a0 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_a1 == coeff[i][4],"m_a1 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_a2 == coeff[i][5],"m_a2 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_b0 == coeff[i][0],"m_b0 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_b1 == coeff[i][1],"m_b1 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_b2 == coeff[i][2],"m_b2 mismatch.\n");
	}

	double b = 0;
	double b2 = 0;
	for(int i=0;i<10000;i++) 
	{
		double a=0;
		if (i==10) a = 1;
		b2 = b;
		b = f.filter(a);
		assert_print(!isnan(b),"Custom filter output is NAN\n");
		if ((i>20) && (i<100)) {
			assert_print((b != 0) || (b2 != 0),
				     "Custom output is zero\n");
		}
	}
	fprintf(stderr,"Final filter value: %e\n",b);
	assert_print(fabs(b) < 1E-25,"Custom filter value for t->inf to high!");

	return 0;
}